

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

ElementMatcherPairs * __thiscall
testing::internal::MaxBipartiteMatchState::Compute(MaxBipartiteMatchState *this)

{
  bool bVar1;
  size_t sVar2;
  reference pvVar3;
  ostream *poVar4;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *pvVar5;
  undefined8 *in_RSI;
  ElementMatcherPairs *in_RDI;
  size_t irhs;
  size_t ilhs_1;
  size_t ilhs;
  vector<char,_std::allocator<char>_> seen;
  ElementMatcherPairs *result;
  value_type *in_stack_ffffffffffffff38;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  ostream *in_stack_ffffffffffffff50;
  ostream *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  MaxBipartiteMatchState *in_stack_ffffffffffffff68;
  pair<unsigned_long,_unsigned_long> local_68;
  unsigned_long in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *this_00;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__n;
  GTestLogSeverity in_stack_ffffffffffffffbc;
  GTestLog *in_stack_ffffffffffffffc0;
  size_type local_30;
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1636ae);
  for (local_30 = 0; sVar2 = MatchMatrix::LhsSize((MatchMatrix *)*in_RSI), local_30 < sVar2;
      local_30 = local_30 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 1),
                        local_30);
    bVar1 = IsTrue(*pvVar3 == 0xffffffffffffffff);
    if (!bVar1) {
      GTestLog::GTestLog(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                         in_stack_ffffffffffffffb0,(int)(in_stack_ffffffffffffffa8 >> 0x20));
      poVar4 = GTestLog::GetStream((GTestLog *)&stack0xffffffffffffffc0);
      in_stack_ffffffffffffff68 =
           (MaxBipartiteMatchState *)
           std::operator<<(poVar4,"Condition left_[ilhs] == kUnused failed. ");
      in_stack_ffffffffffffff60 = std::operator<<((ostream *)in_stack_ffffffffffffff68,"ilhs: ");
      in_stack_ffffffffffffff58 =
           (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff60,local_30);
      in_stack_ffffffffffffff50 = std::operator<<(in_stack_ffffffffffffff58,", left_[ilhs]: ");
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 1),
                          local_30);
      std::ostream::operator<<(in_stack_ffffffffffffff50,*pvVar3);
      GTestLog::~GTestLog((GTestLog *)in_stack_ffffffffffffff40);
    }
    MatchMatrix::RhsSize((MatchMatrix *)*in_RSI);
    in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
    std::vector<char,_std::allocator<char>_>::assign
              (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,(value_type *)0x163856
              );
    TryAugment(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff58);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x1638a1);
  this_00 = (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)0x0;
  while (__n = this_00,
        pvVar5 = (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 1)
                              ), this_00 < pvVar5) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 1),
                        (size_type)__n);
    if (*pvVar3 != 0xffffffffffffffff) {
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                (&local_68,(unsigned_long *)&stack0xffffffffffffffb0,
                 (unsigned_long *)&stack0xffffffffffffffa8);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::push_back(this_00,in_stack_ffffffffffffff38);
    }
    this_00 = (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)((long)&(__n->
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff50);
  return in_RDI;
}

Assistant:

ElementMatcherPairs Compute() {
    // 'seen' is used for path finding { 0: unseen, 1: seen }.
    ::std::vector<char> seen;
    // Searches the residual flow graph for a path from each left node to
    // the sink in the residual flow graph, and if one is found, add flow
    // to the graph. It's okay to search through the left nodes once. The
    // edge from the implicit source node to each previously-visited left
    // node will have flow if that left node has any path to the sink
    // whatsoever. Subsequent augmentations can only add flow to the
    // network, and cannot take away that previous flow unit from the source.
    // Since the source-to-left edge can only carry one flow unit (or,
    // each element can be matched to only one matcher), there is no need
    // to visit the left nodes more than once looking for augmented paths.
    // The flow is known to be possible or impossible by looking at the
    // node once.
    for (size_t ilhs = 0; ilhs < graph_->LhsSize(); ++ilhs) {
      // Reset the path-marking vector and try to find a path from
      // source to sink starting at the left_[ilhs] node.
      GTEST_CHECK_(left_[ilhs] == kUnused)
          << "ilhs: " << ilhs << ", left_[ilhs]: " << left_[ilhs];
      // 'seen' initialized to 'graph_->RhsSize()' copies of 0.
      seen.assign(graph_->RhsSize(), 0);
      TryAugment(ilhs, &seen);
    }
    ElementMatcherPairs result;
    for (size_t ilhs = 0; ilhs < left_.size(); ++ilhs) {
      size_t irhs = left_[ilhs];
      if (irhs == kUnused) continue;
      result.push_back(ElementMatcherPair(ilhs, irhs));
    }
    return result;
  }